

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_type_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  connectdata *pcVar1;
  FILEPROTO *pFVar2;
  CURLcode CVar3;
  char *in_RAX;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  ftpstate instate_00;
  char *pcVar7;
  char *pcVar8;
  char *local_38;
  
  if (99 < ftpcode - 200U) {
    Curl_failf(data,"Couldn\'t set desired mode");
    return CURLE_FTP_COULDNT_SET_TYPE;
  }
  pcVar1 = data->conn;
  local_38 = in_RAX;
  if (ftpcode != 200) {
    Curl_infof(data,"Got a %03d response code instead of the assumed 200");
  }
  switch(instate) {
  case FTP_TYPE:
    CVar3 = ftp_state_size(data,pcVar1);
    return CVar3;
  case FTP_LIST_TYPE:
    pcVar1 = data->conn;
    if (((data->set).ftp_filemethod == '\x02') &&
       (pFVar2 = (data->req).p.file, pFVar2->path != (char *)0x0)) {
      local_38 = (char *)0x0;
      CVar3 = Curl_urldecode(pFVar2->path,0,&local_38,(size_t *)0x0,REJECT_CTRL);
      pcVar8 = local_38;
      pcVar4 = (char *)0x0;
      if (CVar3 == CURLE_OK) {
        pcVar4 = strrchr(local_38,0x2f);
        if (pcVar4 == (char *)0x0) {
          (*Curl_cfree)(pcVar8);
          pcVar4 = (char *)0x0;
        }
        else {
          lVar5 = 1;
          if ((long)pcVar4 - (long)pcVar8 != 0) {
            lVar5 = (long)pcVar4 - (long)pcVar8;
          }
          pcVar8[lVar5] = '\0';
          pcVar4 = pcVar8;
        }
      }
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
    }
    else {
      pcVar4 = (char *)0x0;
    }
    pcVar8 = (data->set).str[6];
    if ((pcVar8 == (char *)0x0) && (pcVar8 = "NLST", ((data->state).field_0x6d2 & 1) == 0)) {
      pcVar8 = "LIST";
    }
    pcVar7 = " ";
    pcVar6 = pcVar4;
    if (pcVar4 == (char *)0x0) {
      pcVar7 = "";
      pcVar6 = "";
    }
    pcVar8 = curl_maprintf("%s%s%s",pcVar8,pcVar7,pcVar6);
    (*Curl_cfree)(pcVar4);
    if (pcVar8 == (char *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
    }
    else {
      CVar3 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"%s",pcVar8);
      (*Curl_cfree)(pcVar8);
      if (CVar3 == CURLE_OK) {
        (data->conn->proto).ftpc.state = FTP_LIST;
      }
    }
    break;
  case FTP_RETR_TYPE:
    instate_00 = FTP_RETR_PREQUOTE;
    goto LAB_00510bcc;
  case FTP_STOR_TYPE:
    instate_00 = FTP_STOR_PREQUOTE;
LAB_00510bcc:
    CVar3 = ftp_state_quote(data,true,instate_00);
    return CVar3;
  default:
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

static CURLcode ftp_state_type_resp(struct Curl_easy *data,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  if(ftpcode/100 != 2) {
    /* "sasserftpd" and "(u)r(x)bot ftpd" both responds with 226 after a
       successful 'TYPE I'. While that is not as RFC959 says, it is still a
       positive response code and we allow that. */
    failf(data, "Couldn't set desired mode");
    return CURLE_FTP_COULDNT_SET_TYPE;
  }
  if(ftpcode != 200)
    infof(data, "Got a %03d response code instead of the assumed 200",
          ftpcode);

  if(instate == FTP_TYPE)
    result = ftp_state_size(data, conn);
  else if(instate == FTP_LIST_TYPE)
    result = ftp_state_list(data);
  else if(instate == FTP_RETR_TYPE)
    result = ftp_state_retr_prequote(data);
  else if(instate == FTP_STOR_TYPE)
    result = ftp_state_stor_prequote(data);

  return result;
}